

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O2

void EBMOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,Real dt,bool is_velocity,string redistribution_type)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  Box *pBVar1;
  EBCellFlagFab *pEVar2;
  string redistribution_type_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int j;
  uint uVar6;
  FabType FVar7;
  uint uVar8;
  int iVar9;
  EBFArrayBoxFactory *this;
  ulong uVar10;
  FabArray<amrex::EBCellFlagFab> *pFVar11;
  MultiCutFab *pMVar12;
  FabArray<amrex::FArrayBox> *pFVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  FabArray<amrex::FArrayBox> *pFVar17;
  IntVect *pIVar18;
  Dim3 *pDVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  Array4<const_double> *pAVar29;
  long lVar30;
  ulong uVar31;
  Array4<const_double> *pAVar32;
  int k_3;
  long lVar33;
  long lVar34;
  int j_4;
  long lVar35;
  int k_2;
  long lVar36;
  long lVar37;
  undefined8 uVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  Periodicity PVar45;
  undefined8 in_stack_fffffffffffff498;
  long in_stack_fffffffffffff4a0;
  Array4<const_double> *in_stack_fffffffffffff4a8;
  Array4<double> fy;
  Box result;
  int local_a6c;
  int iStack_a68;
  Box local_a4c;
  FabArray<amrex::FArrayBox> *local_a30;
  long local_a28;
  double *local_a20;
  Array4<const_double> fcy;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fx;
  Vector<int,_std::allocator<int>_> *local_918;
  Array4<const_double> fcz;
  Array4<double> zed;
  Array4<double> yed;
  Array4<const_double> apx;
  Box local_72c;
  Box local_710;
  Box local_6f4;
  Array4<const_double> u;
  Array4<const_double> uc;
  Array4<const_double> fcx_1;
  Array4<const_double> apy;
  Array4<const_double> q;
  Array4<const_double> v;
  MFItInfo local_54c;
  Array4<const_double> vfrac;
  Array4<const_double> apz;
  Array4<const_double> ccc;
  Array4<double> advc_arr;
  Array4<const_double> wc;
  Array4<const_double> vc;
  string local_390 [32];
  MultiFab sstate_tmp;
  MultiFab advc;
  Array4<const_double> w;
  
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < state_comp + ncomp) {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x152,(char *)0x0);
  }
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < aofs_comp + ncomp) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x153,(char *)0x0);
  }
  iVar20 = ncomp + edge_comp;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar20) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x154,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar20) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x155,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar20) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x156,(char *)0x0);
  }
  iVar20 = fluxes_comp + ncomp;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar20) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x157,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar20) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x158,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar20) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x159,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15a,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15b,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15c,(char *)0x0);
  }
  if ((!known_edgestate) &&
     ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 2)) {
    amrex::Assert_host("state.nGrow() >= 2",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x161,(char *)0x0);
  }
  bVar5 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&state->super_FabArray<amrex::FArrayBox>);
  if (!bVar5) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x163,(char *)0x0);
  }
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                        &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  bxs = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ = 0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ = 1;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_12_ =
       SUB1612((undefined1  [16])0x0,4);
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_16_ =
       (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (&advc,bxs,dm,ncomp,3,(MFInfo *)&sstate_tmp,(FabFactory<amrex::FArrayBox> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0);
  local_54c.num_streams = amrex::Gpu::Device::max_gpu_streams;
  local_54c.do_tiling = true;
  local_54c.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_54c.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_54c.tilesize.vect[2] = DAT_007d7ef0;
  local_54c.dynamic = true;
  local_54c.device_sync = true;
  local_a30 = &state->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter((MFIter *)&sstate_tmp,(FabArrayBase *)aofs,&local_54c);
  uVar6 = (uint)!known_edgestate;
  iVar20 = uVar6 * 2;
  uVar10 = 0;
  if (0 < ncomp) {
    uVar10 = (ulong)(uint)ncomp;
  }
  while( true ) {
    if (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
        m_bndryReg.m_loshft.vect[2] <=
        sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
        m_bndryReg.m_loshft.vect[0]) break;
    amrex::MFIter::tilebox(&local_a4c,(MFIter *)&sstate_tmp);
    amrex::MFIter::nodaltilebox(&local_6f4,(MFIter *)&sstate_tmp,0);
    amrex::MFIter::nodaltilebox(&local_710,(MFIter *)&sstate_tmp,1);
    amrex::MFIter::nodaltilebox(&local_72c,(MFIter *)&sstate_tmp,2);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&xed,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&yed,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&zed,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
    pFVar11 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    pIVar18 = &sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               m_bndryReg.m_loshft;
    if (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._52_8_ !=
        0) {
      pIVar18 = (IntVect *)
                ((long)sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat
                       .m_op.m_bndryReg.m_loshft.vect[0] * 4 +
                *(long *)sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op._52_8_);
    }
    pEVar2 = (pFVar11->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[pIVar18->vect[0]];
    fcx_1.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
    fcx_1.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
    pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
    fcx_1.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    fcx_1.begin.x = (pBVar1->smallend).vect[0];
    fcx_1.begin.y = (pBVar1->smallend).vect[1];
    lVar28 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    lVar33 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
    lVar34 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    fcx_1.jstride = (lVar33 - (pBVar1->smallend).vect[0]) + 1;
    fcx_1.kstride =
         (lVar28 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
         fcx_1.jstride;
    fcx_1.nstride = (lVar34 - fcx_1.begin.z) * fcx_1.kstride;
    fcx_1.end._0_8_ = lVar33 + 1U & 0xffffffff | lVar28 << 0x20;
    fcx_1.end.z = (int)lVar34;
    FVar7 = amrex::EBCellFlagFab::getType(pEVar2,&local_a4c);
    if (FVar7 == covered) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&uc,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp
                 ,aofs_comp);
      auVar4 = _DAT_006f8e90;
      auVar3 = _DAT_006f8e80;
      lVar28 = (long)uc.p +
               ((long)local_a4c.smallend.vect[1] - (long)uc.begin.y) * uc.jstride * 8 +
               ((long)local_a4c.smallend.vect[2] - (long)uc.begin.z) * uc.kstride * 8 +
               (long)local_a4c.smallend.vect[0] * 8 + (long)uc.begin.x * -8 + 8;
      uVar8 = local_a4c.bigend.vect[0] - local_a4c.smallend.vect[0];
      auVar39._4_4_ = 0;
      auVar39._0_4_ = uVar8;
      auVar39._8_4_ = uVar8;
      auVar39._12_4_ = 0;
      auVar39 = auVar39 ^ _DAT_006f8e90;
      local_a20 = xed.p;
      for (uVar15 = 0; lVar33 = lVar28, lVar34 = (long)local_a4c.smallend.vect[2], uVar15 != uVar10;
          uVar15 = uVar15 + 1) {
        for (; lVar14 = (long)local_a4c.smallend.vect[1], lVar22 = lVar33,
            lVar34 <= local_a4c.bigend.vect[2]; lVar34 = lVar34 + 1) {
          for (; lVar14 <= local_a4c.bigend.vect[1]; lVar14 = lVar14 + 1) {
            if (local_a4c.smallend.vect[0] <= local_a4c.bigend.vect[0]) {
              uVar31 = 0;
              do {
                auVar41._8_4_ = (int)uVar31;
                auVar41._0_8_ = uVar31;
                auVar41._12_4_ = (int)(uVar31 >> 0x20);
                auVar42 = (auVar41 | auVar3) ^ auVar4;
                bVar5 = auVar39._0_4_ < auVar42._0_4_;
                iVar9 = auVar39._4_4_;
                iVar40 = auVar42._4_4_;
                if ((bool)(~(iVar9 < iVar40 || iVar40 == iVar9 && bVar5) & 1)) {
                  *(undefined8 *)(lVar22 + -8 + uVar31 * 8) = 0x483d6329f1c35ca5;
                }
                if (iVar9 >= iVar40 && (iVar40 != iVar9 || !bVar5)) {
                  *(undefined8 *)(lVar22 + uVar31 * 8) = 0x483d6329f1c35ca5;
                }
                uVar31 = uVar31 + 2;
              } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar31);
            }
            lVar22 = lVar22 + uc.jstride * 8;
          }
          lVar33 = lVar33 + uc.kstride * 8;
        }
        lVar28 = lVar28 + uc.nstride * 8;
      }
      lVar28 = (long)local_6f4.smallend.vect[1];
      local_a28 = (long)local_6f4.smallend.vect[2];
      lVar33 = (long)fx.p +
               (lVar28 - fx.begin.y) * fx.jstride * 8 + (local_a28 - fx.begin.z) * fx.kstride * 8 +
               (long)local_6f4.smallend.vect[0] * 8 + (long)fx.begin.x * -8;
      pdVar24 = (double *)
                ((long)xed.p +
                (lVar28 - xed.begin.y) * xed.jstride * 8 +
                (local_a28 - xed.begin.z) * xed.kstride * 8 + (long)local_6f4.smallend.vect[0] * 8 +
                (long)xed.begin.x * -8);
      for (uVar15 = 0; pdVar23 = pdVar24, lVar34 = local_a28, pdVar24 = pdVar23, lVar14 = lVar33,
          uVar15 != uVar10; uVar15 = uVar15 + 1) {
        for (; lVar22 = lVar28, pdVar25 = pdVar24, lVar36 = lVar14,
            lVar34 <= local_6f4.bigend.vect[2]; lVar34 = lVar34 + 1) {
          for (; lVar22 <= local_6f4.bigend.vect[1]; lVar22 = lVar22 + 1) {
            if (local_6f4.smallend.vect[0] <= local_6f4.bigend.vect[0]) {
              lVar27 = 0;
              do {
                *(undefined8 *)(lVar36 + lVar27 * 8) = 0;
                pdVar25[lVar27] = 1e+40;
                lVar27 = lVar27 + 1;
              } while ((local_6f4.bigend.vect[0] - local_6f4.smallend.vect[0]) + 1 != (int)lVar27);
            }
            pdVar25 = pdVar25 + xed.jstride;
            lVar36 = lVar36 + fx.jstride * 8;
          }
          pdVar24 = pdVar24 + xed.kstride;
          lVar14 = lVar14 + fx.kstride * 8;
        }
        lVar33 = lVar33 + fx.nstride * 8;
        pdVar24 = pdVar23 + xed.nstride;
        local_a20 = pdVar23;
      }
      lVar14 = (long)local_710.smallend.vect[1];
      lVar22 = (long)local_710.smallend.vect[2];
      lVar34 = (long)yed.p +
               (lVar14 - yed.begin.y) * yed.jstride * 8 + (lVar22 - yed.begin.z) * yed.kstride * 8 +
               (long)local_710.smallend.vect[0] * 8 + (long)yed.begin.x * -8;
      lVar33 = CONCAT44(fy.kstride._4_4_,(int)fy.kstride) * 8;
      lVar28 = CONCAT44(fy.jstride._4_4_,(int)fy.jstride) * 8;
      lVar36 = (long)fy.p +
               (lVar14 - fy.begin.y) * lVar28 + (lVar22 - fy.begin.z) * lVar33 +
               (long)local_710.smallend.vect[0] * 8 + (long)fy.begin.x * -8;
      for (uVar15 = 0; lVar27 = lVar34, lVar37 = lVar22, lVar30 = lVar36, uVar15 != uVar10;
          uVar15 = uVar15 + 1) {
        for (; lVar16 = lVar14, lVar26 = lVar30, lVar35 = lVar27, lVar37 <= local_710.bigend.vect[2]
            ; lVar37 = lVar37 + 1) {
          for (; lVar16 <= local_710.bigend.vect[1]; lVar16 = lVar16 + 1) {
            if (local_710.smallend.vect[0] <= local_710.bigend.vect[0]) {
              lVar21 = 0;
              do {
                *(undefined8 *)(lVar26 + lVar21 * 8) = 0;
                *(undefined8 *)(lVar35 + lVar21 * 8) = 0x483d6329f1c35ca5;
                lVar21 = lVar21 + 1;
              } while ((local_710.bigend.vect[0] - local_710.smallend.vect[0]) + 1 != (int)lVar21);
            }
            lVar35 = lVar35 + yed.jstride * 8;
            lVar26 = lVar26 + lVar28;
          }
          lVar27 = lVar27 + yed.kstride * 8;
          lVar30 = lVar30 + lVar33;
        }
        lVar34 = lVar34 + yed.nstride * 8;
        lVar36 = lVar36 + CONCAT44(fy.nstride._4_4_,(uint)fy.nstride) * 8;
      }
      pAVar29 = (Array4<const_double> *)(long)local_72c.smallend.vect[1];
      lVar33 = (long)local_72c.smallend.vect[2];
      in_stack_fffffffffffff4a0 = fz.kstride * 8;
      lVar34 = ((long)pAVar29 - (long)zed.begin.y) * zed.jstride * 8 +
               (lVar33 - zed.begin.z) * zed.kstride * 8 + (long)local_72c.smallend.vect[0] * 8 +
               (long)zed.begin.x * -8 + (long)zed.p;
      lVar28 = ((long)pAVar29 - (long)fz.begin.y) * fz.jstride * 8 +
               (lVar33 - fz.begin.z) * in_stack_fffffffffffff4a0 +
               (long)local_72c.smallend.vect[0] * 8 + (long)fz.begin.x * -8 + (long)fz.p;
      for (uVar15 = 0; lVar14 = lVar34, lVar22 = lVar28, lVar36 = lVar33, uVar15 != uVar10;
          uVar15 = uVar15 + 1) {
        for (; lVar27 = lVar22, pAVar32 = pAVar29, lVar37 = lVar14,
            lVar36 <= local_72c.bigend.vect[2]; lVar36 = lVar36 + 1) {
          for (; (long)pAVar32 <= (long)local_72c.bigend.vect[1];
              pAVar32 = (Array4<const_double> *)((long)&pAVar32->p + 1)) {
            if (local_72c.smallend.vect[0] <= local_72c.bigend.vect[0]) {
              lVar30 = 0;
              do {
                *(undefined8 *)(lVar27 + lVar30 * 8) = 0;
                *(undefined8 *)(lVar37 + lVar30 * 8) = 0x483d6329f1c35ca5;
                lVar30 = lVar30 + 1;
              } while ((local_72c.bigend.vect[0] - local_72c.smallend.vect[0]) + 1 != (int)lVar30);
            }
            lVar37 = lVar37 + zed.jstride * 8;
            lVar27 = lVar27 + fz.jstride * 8;
          }
          lVar14 = lVar14 + zed.kstride * 8;
          lVar22 = lVar22 + in_stack_fffffffffffff4a0;
        }
        lVar34 = lVar34 + zed.nstride * 8;
        lVar28 = lVar28 + fz.nstride * 8;
      }
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&uc,&ucorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&vc,&vcorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&wc,&wcorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
      result.btype.itype = local_a4c.btype.itype;
      result.smallend.vect[0] = local_a4c.smallend.vect[0] + uVar6 * -2;
      result.smallend.vect[1] = local_a4c.smallend.vect[1] + uVar6 * -2;
      result.smallend.vect[2] = local_a4c.smallend.vect[2] + uVar6 * -2;
      result.bigend.vect[0] = local_a4c.bigend.vect[0] + iVar20;
      result.bigend.vect[1] = local_a4c.bigend.vect[1] + iVar20;
      result.bigend.vect[2] = local_a4c.bigend.vect[2] + iVar20;
      FVar7 = amrex::EBCellFlagFab::getType(pEVar2,&result);
      pAVar29 = (Array4<const_double> *)(ulong)is_velocity;
      if (FVar7 == regular) {
        pAVar29 = in_stack_fffffffffffff4a8;
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result,local_a30,(MFIter *)&sstate_tmp,state_comp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&fcy,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&fcz,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&ccc,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
          MOL::ComputeEdgeState
                    (&local_a4c,&xed,&yed,&zed,(Array4<const_double> *)&result,ncomp,&fcy,&fcz,&ccc,
                     &geom->domain,bcs,d_bcrec_ptr,is_velocity);
          pAVar29 = in_stack_fffffffffffff4a8;
        }
        result.smallend.vect[0] = (int)xed.p;
        result.smallend.vect[1] = (int)((ulong)xed.p >> 0x20);
        result.smallend.vect[2] = (int)xed.jstride;
        result.bigend.vect[0] = (int)((ulong)xed.jstride >> 0x20);
        result.bigend.vect[1] = (int)xed.kstride;
        result.bigend.vect[2] = (int)((ulong)xed.kstride >> 0x20);
        result.btype.itype = (uint)xed.nstride;
        fcy.p = yed.p;
        fcy.jstride = yed.jstride;
        fcy.kstride = yed.kstride;
        fcy.nstride = yed.nstride;
        fcy.begin.z = yed.begin.z;
        fcy.end.z = yed.end.z;
        fcy.end.x = yed.end.x;
        fcy.end.y = yed.end.y;
        fcy.ncomp = yed.ncomp;
        fcz.p = zed.p;
        fcz.jstride = zed.jstride;
        fcz.kstride = zed.kstride;
        fcz.nstride = zed.nstride;
        fcz.begin.z = zed.begin.z;
        fcz.end.z = zed.end.z;
        fcz.end.x = zed.end.x;
        fcz.end.y = zed.end.y;
        fcz.ncomp = zed.ncomp;
        HydroUtils::ComputeFluxes
                  (&local_a4c,&fx,&fy,&fz,&uc,&vc,&wc,(Array4<const_double> *)&result,&fcy,&fcz,geom
                   ,ncomp,true);
        result.smallend.vect[0] = (int)fx.p;
        result.smallend.vect[1] = (int)((ulong)fx.p >> 0x20);
        result.smallend.vect[2] = (int)fx.jstride;
        result.bigend.vect[0] = fx.jstride._4_4_;
        result.bigend.vect[1] = (int)fx.kstride;
        result.bigend.vect[2] = fx.kstride._4_4_;
        result.btype.itype = fx.nstride._0_4_;
        fcy.p = fy.p;
        fcy.jstride = CONCAT44(fy.jstride._4_4_,(int)fy.jstride);
        fcy.kstride = CONCAT44(fy.kstride._4_4_,(int)fy.kstride);
        fcy.nstride = CONCAT44(fy.nstride._4_4_,(uint)fy.nstride);
        fcy.begin.z = fy.begin.z;
        fcy.end.z = fy.end.z;
        fcy.end.y = fy.end.y;
        fcy.end.x = fy.end.x;
        fcy.ncomp = fy.ncomp;
        fcz.p = fz.p;
        fcz.jstride = fz.jstride;
        fcz.kstride = fz.kstride;
        fcz.nstride = fz.nstride;
        fcz.begin.z = fz.begin.z;
        fcz.begin.x = fz.begin.x;
        fcz.begin.y = fz.begin.y;
        fcz.end.z = fz.end.z;
        fcz.end.x = fz.end.x;
        fcz.end.y = fz.end.y;
        fcz.ncomp = fz.ncomp;
        HydroUtils::ComputeDivergence
                  (&local_a4c,&advc_arr,(Array4<const_double> *)&result,&fcy,&fcz,ncomp,geom,-1.0,
                   true);
      }
      else {
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fcy,this);
        amrex::MultiCutFab::const_array
                  ((Array4<const_double> *)&result,(MultiCutFab *)fcy.p,(MFIter *)&sstate_tmp);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fcz,this);
        amrex::MultiCutFab::const_array(&fcy,(MultiCutFab *)fcz.jstride,(MFIter *)&sstate_tmp);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&ccc,this);
        amrex::MultiCutFab::const_array(&fcz,(MultiCutFab *)ccc.kstride,(MFIter *)&sstate_tmp);
        pMVar12 = amrex::EBFArrayBoxFactory::getCentroid(this);
        amrex::MultiCutFab::const_array(&ccc,pMVar12,(MFIter *)&sstate_tmp);
        pFVar13 = &amrex::EBFArrayBoxFactory::getVolFrac(this)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&vfrac,pFVar13,(MFIter *)&sstate_tmp);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&apy,this);
        amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)apy.p,(MFIter *)&sstate_tmp);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&apz,this);
        amrex::MultiCutFab::const_array(&apy,(MultiCutFab *)apz.jstride,(MFIter *)&sstate_tmp);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&q,this);
        amrex::MultiCutFab::const_array(&apz,(MultiCutFab *)q.kstride,(MFIter *)&sstate_tmp);
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&q,local_a30,(MFIter *)&sstate_tmp,state_comp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&u,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&v,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&w,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
          ComputeEdgeState(&local_a4c,&xed,&yed,&zed,&q,ncomp,&u,&v,&w,&geom->domain,bcs,d_bcrec_ptr
                           ,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,&vfrac,
                           (Array4<const_amrex::EBCellFlag> *)&fcx_1,SUB81(pAVar29,0));
        }
        q.p = xed.p;
        q.jstride = xed.jstride;
        q.kstride = xed.kstride;
        q.nstride = xed.nstride;
        q.begin.z = xed.begin.z;
        q.end.z = xed.end.z;
        q.end.x = xed.end.x;
        q.end.y = xed.end.y;
        q.ncomp = xed.ncomp;
        u.p = yed.p;
        u.jstride = yed.jstride;
        u.kstride = yed.kstride;
        u.nstride = yed.nstride;
        u.begin.z = yed.begin.z;
        u.end.z = yed.end.z;
        u.end.x = yed.end.x;
        u.end.y = yed.end.y;
        u.ncomp = yed.ncomp;
        v.p = zed.p;
        v.jstride = zed.jstride;
        v.kstride = zed.kstride;
        v.nstride = zed.nstride;
        v.begin.z = zed.begin.z;
        v.end.z = zed.end.z;
        v.end.x = zed.end.x;
        v.end.y = zed.end.y;
        v.ncomp = zed.ncomp;
        HydroUtils::EB_ComputeFluxes
                  (&local_a4c,&fx,&fy,&fz,&uc,&vc,&wc,&q,&u,&v,&apx,&apy,&apz,geom,ncomp,
                   (Array4<const_amrex::EBCellFlag> *)&fcx_1,true);
        auVar3 = (undefined1  [16])fx._24_16_;
        q.p = fx.p;
        q.jstride = fx.jstride;
        q.kstride = fx.kstride;
        q.nstride = fx.nstride;
        q.begin.z = fx.begin.z;
        q.begin.x = fx.begin.x;
        q.begin.y = fx.begin.y;
        q.end.z = fx.end.z;
        q.end.x = fx.end.x;
        q.end.y = fx.end.y;
        q.ncomp = fx.ncomp;
        u.p = fy.p;
        u.begin.z = fy.begin.z;
        u.end.z = fy.end.z;
        u.ncomp = fy.ncomp;
        v.p = fz.p;
        v.jstride = fz.jstride;
        v.kstride = fz.kstride;
        v.nstride = fz.nstride;
        v.begin.z = fz.begin.z;
        v.begin.x = fz.begin.x;
        v.begin.y = fz.begin.y;
        v.end.z = fz.end.z;
        v.end.x = fz.end.x;
        v.end.y = fz.end.y;
        v.ncomp = fz.ncomp;
        fx._24_16_ = auVar3;
        HydroUtils::EB_ComputeDivergence(&local_a4c,&advc_arr,&q,&u,&v,&vfrac,ncomp,geom,-1.0,true);
      }
    }
    amrex::MFIter::operator++((MFIter *)&sstate_tmp);
    in_stack_fffffffffffff4a8 = pAVar29;
  }
  amrex::MFIter::~MFIter((MFIter *)&sstate_tmp);
  PVar45 = amrex::Geometry::periodicity(geom);
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ =
       (undefined1)PVar45.period.vect[0];
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ =
       PVar45.period.vect._1_7_;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       PVar45.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&sstate_tmp,false);
  amrex::MultiFab::MultiFab(&sstate_tmp);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          redistribution_type._M_dataplus._M_p,"StateRedist");
  pFVar17 = local_a30;
  pFVar13 = &aofs->super_FabArray<amrex::FArrayBox>;
  if (bVar5) {
    fx.p = (double *)0x1;
    fx.jstride = 0;
    fx.kstride = 0;
    fx.nstride = 0;
    fx.begin.x = 0;
    fx.begin.y = 0;
    pFVar13 = &sstate_tmp.super_FabArray<amrex::FArrayBox>;
    amrex::MultiFab::define
              ((MultiFab *)pFVar13,bxs,dm,ncomp,
               (((FabArray<amrex::FArrayBox> *)&local_a30->super_FabArrayBase)->super_FabArrayBase).
               n_grow.vect[0],(MFInfo *)&fx,(FabFactory<amrex::FArrayBox> *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fx.kstride);
    amrex::MultiFab::Copy
              ((MultiFab *)pFVar13,aofs,aofs_comp,0,ncomp,
               (((FabArray<amrex::FArrayBox> *)&pFVar17->super_FabArrayBase)->super_FabArrayBase).
               n_grow.vect[0]);
  }
  local_54c.do_tiling = true;
  local_54c.tilesize.vect[2] = DAT_007d7ef0;
  local_54c.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_54c.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_54c.dynamic = true;
  amrex::MFIter::MFIter((MFIter *)&fx,(FabArrayBase *)aofs,&local_54c);
  do {
    if (fx.begin.z <= fx.begin.x) {
      amrex::MFIter::~MFIter((MFIter *)&fx);
      amrex::MultiFab::~MultiFab(&sstate_tmp);
      amrex::MultiFab::~MultiFab(&advc);
      return;
    }
    amrex::MFIter::tilebox((Box *)&apx,(MFIter *)&fx);
    pFVar11 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    pDVar19 = &fx.begin;
    if (local_918 != (Vector<int,_std::allocator<int>_> *)0x0) {
      pDVar19 = (Dim3 *)((local_918->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + fx.begin.x);
    }
    pEVar2 = (pFVar11->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[pDVar19->x];
    fz.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
    fz.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
    pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
    fz.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    fz.begin.x = (pBVar1->smallend).vect[0];
    fz.begin.y = (pBVar1->smallend).vect[1];
    lVar28 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    lVar33 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
    lVar34 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    fz.jstride = (lVar33 - (pBVar1->smallend).vect[0]) + 1;
    fz.kstride = (lVar28 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                 fz.jstride;
    fz.nstride = (lVar34 - fz.begin.z) * fz.kstride;
    fz.end._0_8_ = lVar33 + 1U & 0xffffffff | lVar28 << 0x20;
    fz.end.z = (int)lVar34;
    FVar7 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&apx);
    iVar20 = (int)in_stack_fffffffffffff4a0;
    if (FVar7 != covered) {
      fy.nstride._0_4_ = (uint)apx.nstride;
      fy.jstride._0_4_ = (int)apx.jstride + -4;
      fy.jstride._4_4_ = apx.jstride._4_4_ + 4;
      fy.p = (double *)CONCAT44(apx.p._4_4_ + -4,(int)apx.p + -4);
      fy.kstride._0_4_ = (int)apx.kstride + 4;
      fy.kstride._4_4_ = apx.kstride._4_4_ + 4;
      FVar7 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&fy);
      if (FVar7 == regular) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&fy,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&fx,aofs_comp);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&xed,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&fx);
        in_stack_fffffffffffff4a8 = (Array4<const_double> *)(long)apx.p._4_4_;
        lVar33 = (long)(int)apx.jstride;
        in_stack_fffffffffffff4a0 = CONCAT44(fy.kstride._4_4_,(int)fy.kstride) * 8;
        lVar28 = CONCAT44(fy.jstride._4_4_,(int)fy.jstride) * 8;
        lVar14 = ((long)in_stack_fffffffffffff4a8 - (long)fy.begin.y) * lVar28 +
                 (lVar33 - fy.begin.z) * in_stack_fffffffffffff4a0 + (long)(int)apx.p * 8 +
                 (long)fy.begin.x * -8 + (long)fy.p;
        lVar34 = ((long)in_stack_fffffffffffff4a8 - (long)xed.begin.y) * xed.jstride * 8 +
                 (lVar33 - xed.begin.z) * xed.kstride * 8 + (long)(int)apx.p * 8 +
                 (long)xed.begin.x * -8 + (long)xed.p;
        for (uVar15 = 0; lVar22 = lVar34, lVar36 = lVar33, lVar27 = lVar14, uVar15 != uVar10;
            uVar15 = uVar15 + 1) {
          for (; pAVar29 = in_stack_fffffffffffff4a8, lVar37 = lVar22, lVar30 = lVar27,
              lVar36 <= apx.kstride._4_4_; lVar36 = lVar36 + 1) {
            for (; (long)pAVar29 <= (long)(int)apx.kstride;
                pAVar29 = (Array4<const_double> *)((long)&pAVar29->p + 1)) {
              if ((int)apx.p <= apx.jstride._4_4_) {
                lVar16 = 0;
                do {
                  *(double *)(lVar30 + lVar16 * 8) =
                       *(double *)(lVar30 + lVar16 * 8) - *(double *)(lVar37 + lVar16 * 8);
                  lVar16 = lVar16 + 1;
                } while ((apx.jstride._4_4_ - (int)apx.p) + 1 != (int)lVar16);
              }
              lVar30 = lVar30 + lVar28;
              lVar37 = lVar37 + xed.jstride * 8;
            }
            lVar22 = lVar22 + xed.kstride * 8;
            lVar27 = lVar27 + in_stack_fffffffffffff4a0;
          }
          lVar14 = lVar14 + CONCAT44(fy.nstride._4_4_,(uint)fy.nstride) * 8;
          lVar34 = lVar34 + xed.nstride * 8;
        }
      }
      else {
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&fy,this);
        amrex::MultiCutFab::const_array
                  ((Array4<const_double> *)&xed,(MultiCutFab *)fy.p,(MFIter *)&fx);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&fy,this);
        amrex::MultiCutFab::const_array
                  ((Array4<const_double> *)&yed,
                   (MultiCutFab *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride),(MFIter *)&fx);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&fy,this);
        amrex::MultiCutFab::const_array
                  ((Array4<const_double> *)&zed,
                   (MultiCutFab *)CONCAT44(fy.kstride._4_4_,(int)fy.kstride),(MFIter *)&fx);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fy,this);
        amrex::MultiCutFab::const_array(&fcx_1,(MultiCutFab *)fy.p,(MFIter *)&fx);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fy,this);
        amrex::MultiCutFab::const_array
                  (&uc,(MultiCutFab *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride),(MFIter *)&fx);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fy,this);
        amrex::MultiCutFab::const_array
                  (&vc,(MultiCutFab *)CONCAT44(fy.kstride._4_4_,(int)fy.kstride),(MFIter *)&fx);
        pMVar12 = amrex::EBFArrayBoxFactory::getCentroid(this);
        amrex::MultiCutFab::const_array(&wc,pMVar12,(MFIter *)&fx);
        pFVar17 = &amrex::EBFArrayBoxFactory::getVolFrac(this)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&advc_arr,pFVar17,(MFIter *)&fx);
        apy.p = (double *)CONCAT44(apx.p._4_4_,(int)apx.p);
        apy.nstride._0_4_ = (uint)apx.nstride;
        apy.kstride._4_4_ = apx.kstride._4_4_;
        apy.kstride._0_4_ = (int)apx.kstride;
        apy.jstride._0_4_ = (int)apx.jstride;
        apy.jstride._4_4_ = apx.jstride._4_4_;
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )redistribution_type._M_dataplus._M_p,"StateRedist");
        if (bVar5) {
          iVar9 = (int)apy.p + -3;
          uVar38 = 0x3fffffffd;
LAB_0042bd61:
          iVar40 = (int)((ulong)uVar38 >> 0x20);
          apy.jstride._0_4_ = (int)apy.jstride + (int)uVar38;
          apy.jstride._4_4_ = apy.jstride._4_4_ + iVar40;
          apy.kstride._0_4_ = (int)apy.kstride + iVar40;
          apy.p = (double *)CONCAT44(apy.p._4_4_ + (int)uVar38,iVar9);
          apy.kstride._4_4_ = apy.kstride._4_4_ + iVar40;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)redistribution_type._M_dataplus._M_p,"FluxRedist");
          if (bVar5) {
            iVar9 = (int)apy.p + -2;
            uVar38 = 0x2fffffffe;
            goto LAB_0042bd61;
          }
        }
        amrex::FArrayBox::FArrayBox((FArrayBox *)&fy,(Box *)&apy,ncomp * 2,true,false,(Arena *)0x0);
        amrex::BaseFab<double>::elixir<double,_0>((Elixir *)&apz,(BaseFab<double> *)&fy);
        iVar40 = fy.begin.x;
        iVar9 = fy.nstride._4_4_;
        uVar6 = (uint)fy.nstride;
        lVar28 = (long)fy.begin.z;
        lVar33 = (long)fy.end.x;
        result._8_8_ = ((long)fy.begin.y - (long)(int)(uint)fy.nstride) + 1;
        local_a6c = fy.begin.y + 1;
        result.bigend.vect._4_8_ = ((lVar28 + 1) - (long)fy.nstride._4_4_) * result._8_8_;
        result.smallend.vect[0] = (int)fy.kstride;
        result.smallend.vect[1] = fy.kstride._4_4_;
        result.btype.itype = (uint)(((lVar33 + 1) - (long)fy.begin.x) * result.bigend.vect._4_8_);
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )redistribution_type._M_dataplus._M_p,"FluxRedist");
        auVar4 = _DAT_006f8e90;
        auVar3 = _DAT_006f8e80;
        if (bVar5) {
          iStack_a68 = (int)(lVar28 + 1);
          uVar8 = ~uVar6 + local_a6c;
          auVar42._4_4_ = 0;
          auVar42._0_4_ = uVar8;
          auVar42._8_4_ = uVar8;
          auVar42._12_4_ = 0;
          lVar34 = CONCAT44(result.smallend.vect[1],result.smallend.vect[0]) + 8;
          auVar42 = auVar42 ^ _DAT_006f8e90;
          for (lVar28 = (long)iVar40; lVar14 = (long)iVar9, lVar22 = lVar34,
              lVar28 < (int)(lVar33 + 1); lVar28 = lVar28 + 1) {
            for (; lVar14 <= (long)iStack_a68 + -1; lVar14 = lVar14 + 1) {
              if ((int)uVar6 < local_a6c) {
                uVar15 = 0;
                do {
                  auVar43._8_4_ = (int)uVar15;
                  auVar43._0_8_ = uVar15;
                  auVar43._12_4_ = (int)(uVar15 >> 0x20);
                  auVar43 = (auVar43 | auVar3) ^ auVar4;
                  bVar5 = auVar42._0_4_ < auVar43._0_4_;
                  iVar40 = auVar42._4_4_;
                  iVar44 = auVar43._4_4_;
                  if ((bool)(~(iVar40 < iVar44 || iVar44 == iVar40 && bVar5) & 1)) {
                    *(undefined8 *)(lVar22 + -8 + uVar15 * 8) = 0x3ff0000000000000;
                  }
                  if (iVar40 >= iVar44 && (iVar44 != iVar40 || !bVar5)) {
                    *(undefined8 *)(lVar22 + uVar15 * 8) = 0x3ff0000000000000;
                  }
                  uVar15 = uVar15 + 2;
                } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar15);
              }
              lVar22 = lVar22 + result._8_8_ * 8;
            }
            lVar34 = lVar34 + result.bigend.vect._4_8_ * 8;
          }
        }
        fcy.begin.x = (uint)fy.nstride;
        fcy.begin.y = fy.nstride._4_4_;
        fcy.jstride = ((long)fy.begin.y - (long)(int)(uint)fy.nstride) + 1;
        fcy.kstride = (((long)fy.begin.z + 1) - (long)fy.nstride._4_4_) * fcy.jstride;
        fcy.nstride = (((long)fy.end.x + 1) - (long)fy.begin.x) * fcy.kstride;
        fcy.end._0_8_ = (long)fy.begin.y + 1U & 0xffffffff | (long)fy.begin.z + 1 << 0x20;
        fcy.p = (double *)(fcy.nstride * ncomp * 8 + CONCAT44(fy.kstride._4_4_,(int)fy.kstride));
        fcy.begin.z = fy.begin.x;
        fcy.end.z = (int)((long)fy.end.x + 1);
        fcy.ncomp = fy.end.z - ncomp;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&fcz,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&fx);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&ccc,pFVar13,(MFIter *)&fx,0);
        std::__cxx11::string::string(local_390,(string *)redistribution_type._M_dataplus._M_p);
        vfrac.kstride = 0;
        vfrac.nstride = 0;
        vfrac.p = (double *)0x0;
        vfrac.jstride = 0;
        vfrac.begin.x = 1;
        vfrac.begin.y = 1;
        vfrac.begin.z = 1;
        vfrac.end.x = 0;
        vfrac.end.y = 0;
        vfrac.end.z = 0;
        vfrac.ncomp = 0;
        redistribution_type_00._M_string_length._0_1_ = 2;
        redistribution_type_00._M_dataplus._M_p = (pointer)local_390;
        redistribution_type_00._M_string_length._1_7_ = 0;
        redistribution_type_00.field_2._M_local_buf[0] = (char)&vfrac;
        redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)&vfrac >> 8);
        redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff498;
        Redistribution::Apply
                  ((Box *)&apx,ncomp,(Array4<double> *)&fcy,(Array4<double> *)&fcz,&ccc,
                   (Array4<double> *)&result,(Array4<const_amrex::EBCellFlag> *)&fz,
                   (Array4<const_double> *)&xed,(Array4<const_double> *)&yed,
                   (Array4<const_double> *)&zed,(Array4<const_double> *)&advc_arr,&fcx_1,&uc,&vc,&wc
                   ,d_bcrec_ptr,geom,dt,redistribution_type_00,iVar20,0.5,in_stack_fffffffffffff4a8)
        ;
        std::__cxx11::string::~string(local_390);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&fcz,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&fx,
                   aofs_comp);
        in_stack_fffffffffffff4a8 = (Array4<const_double> *)(long)apx.p._4_4_;
        lVar28 = (long)(int)apx.jstride;
        in_stack_fffffffffffff4a0 = fcz.kstride * 8;
        lVar34 = ((long)in_stack_fffffffffffff4a8 - (long)fcz.begin.y) * fcz.jstride * 8 +
                 (lVar28 - fcz.begin.z) * in_stack_fffffffffffff4a0 + (long)(int)apx.p * 8 +
                 (long)fcz.begin.x * -8 + (long)fcz.p;
        lVar33 = ((long)in_stack_fffffffffffff4a8 - (long)fcy.begin.y) * fcy.jstride * 8 +
                 (lVar28 - fcy.begin.z) * fcy.kstride * 8 + (long)(int)apx.p * 8 +
                 (long)fcy.begin.x * -8 + (long)fcy.p;
        for (uVar15 = 0; lVar14 = lVar33, lVar22 = lVar28, lVar36 = lVar34, uVar15 != uVar10;
            uVar15 = uVar15 + 1) {
          for (; pAVar29 = in_stack_fffffffffffff4a8, lVar27 = lVar14, lVar37 = lVar36,
              lVar22 <= apx.kstride._4_4_; lVar22 = lVar22 + 1) {
            for (; (long)pAVar29 <= (long)(int)apx.kstride;
                pAVar29 = (Array4<const_double> *)((long)&pAVar29->p + 1)) {
              if ((int)apx.p <= apx.jstride._4_4_) {
                lVar30 = 0;
                do {
                  *(double *)(lVar37 + lVar30 * 8) =
                       *(double *)(lVar37 + lVar30 * 8) - *(double *)(lVar27 + lVar30 * 8);
                  lVar30 = lVar30 + 1;
                } while ((apx.jstride._4_4_ - (int)apx.p) + 1 != (int)lVar30);
              }
              lVar37 = lVar37 + fcz.jstride * 8;
              lVar27 = lVar27 + fcy.jstride * 8;
            }
            lVar14 = lVar14 + fcy.kstride * 8;
            lVar36 = lVar36 + in_stack_fffffffffffff4a0;
          }
          lVar34 = lVar34 + fcz.nstride * 8;
          lVar33 = lVar33 + fcy.nstride * 8;
        }
        amrex::Gpu::Elixir::~Elixir((Elixir *)&apz);
        amrex::BaseFab<double>::~BaseFab((BaseFab<double> *)&fy);
      }
    }
    amrex::MFIter::operator++((MFIter *)&fx);
  } while( true );
}

Assistant:

void
EBMOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                         MultiFab const& state, int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab const& ucorr,
                                       MultiFab const& vcorr,
                                       MultiFab const& wcorr),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         int  edge_comp,
                         bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         Vector<BCRec> const& bcs,
                         BCRec  const* d_bcrec_ptr,
                         Geometry const&  geom,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););


    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Need 2 grow cells in state to compute the slopes needed to compute the edge state.
    int halo = known_edgestate ? 0 : 2;

    // Create temporary holder for advection term. Needed to fill ghost cells.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
            AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                          Array4<Real const> vc = vcorr.const_array(mfi);,
                          Array4<Real const> wc = wcorr.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);

                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    EBMOL::ComputeEdgeState( bx,
                                             AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag,
                                             is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx,
                                             AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(uc,vc,wc),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted  );

                // Compute divergence
        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz), vfrac,
                                                 ncomp, geom, mult, fluxes_are_area_weighted  );
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);

                }

                // Compute fluxes
                HydroUtils::ComputeFluxes(bx,
                                          AMREX_D_DECL(fx,fy,fz),
                                          AMREX_D_DECL(uc,vc,wc),
                                          AMREX_D_DECL(xed,yed,zed),
                                          geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );
            }
    }
    }

    advc.FillBoundary(geom.periodicity());

    MultiFab sstate_tmp;
    MultiFab* sstate;
    if (redistribution_type == "StateRedist")
    {
      // Create temporary holder for sync "state" passed in via aofs
      // Do this so we're not overwriting the "state" as we go through the redistribution
      // process.
      sstate_tmp.define(state.boxArray(),state.DistributionMap(),ncomp,state.nGrow(),
                        MFInfo(),ebfactory);
      sstate = &sstate_tmp;
      MultiFab::Copy(*sstate,aofs,aofs_comp,0,ncomp,state.nGrow());
    }
    else
    {
      // Doesn't matter what we put here, sstate only gets used for StateRedist
      sstate = &aofs;
    }

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) != FabType::covered)
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);
        FArrayBox tmpfab(gbx, ncomp*2);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
        }
        Array4<Real> divtmp_redist_arr = tmpfab.array(ncomp);

        // Redistribute
        //
        // For StateRedistribution, we use the Sync as the "state".
        // This may lead to oversmoothing.
        //
        Redistribution::Apply( bx, ncomp,  divtmp_redist_arr, advc.array(mfi),
                   sstate->const_array(mfi, 0), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed by EB_ComputeDivergence, thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_redist_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -=  divtmp_redist_arr( i, j, k, n ); });
      }
      else
      {
        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed here, and thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);
        Array4<Real> advc_arr = advc.array(mfi);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -= advc_arr( i, j, k, n ); });
      }
    }
    }
}